

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-trust-schema-pattern.c
# Opt level: O1

int ndn_trust_schema_pattern_from_string
              (ndn_trust_schema_pattern_t *pattern,char *string,uint32_t size)

{
  ndn_trust_schema_pattern_component_t *pnVar1;
  char *pcVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  int __length;
  ndn_trust_schema_pattern_t *pnVar11;
  ndn_trust_schema_pattern_t *pnVar12;
  ndn_trust_schema_pattern_t *extraout_RDX;
  ndn_trust_schema_pattern_t *extraout_RDX_00;
  ndn_trust_schema_pattern_t *extraout_RDX_01;
  ndn_trust_schema_pattern_t *extraout_RDX_02;
  ndn_trust_schema_pattern_t *extraout_RDX_03;
  ndn_trust_schema_pattern_t *extraout_RDX_04;
  ulong uVar13;
  byte bVar14;
  re_registers *in_R8;
  byte bVar15;
  byte bVar16;
  byte *__string;
  bool bVar17;
  undefined1 auStack_a4 [8];
  ndn_trust_schema_pattern_component_t component;
  uint local_44;
  int local_34;
  
  pnVar11 = (ndn_trust_schema_pattern_t *)(ulong)size;
  if (size == 0) {
    return -0x9c;
  }
  if (string[size - 1] == '\0') {
    size = size - 1;
  }
  uVar13 = (ulong)size;
  bVar17 = size != 1;
  if (bVar17) {
    if (*string != '\0') {
      pnVar12 = (ndn_trust_schema_pattern_t *)0x0;
      do {
        pnVar11 = pnVar12;
        if (size - 2 == (int)pnVar12) goto LAB_001139dc;
        pnVar11 = (ndn_trust_schema_pattern_t *)((long)&pnVar12->components[0].type + 1);
        pcVar2 = string + 1 + (long)pnVar12;
        pnVar12 = pnVar11;
      } while (*pcVar2 != '\0');
      bVar17 = (uint)pnVar11 < size - 1;
    }
    if (bVar17) {
      return -0x9d;
    }
  }
LAB_001139dc:
  pattern->components_size = 0;
  if (((byte)*string - 0x28 < 0x35) &&
     (uVar10 = 0x18000000100001,
     (0x18000000100001U >> ((ulong)((byte)*string - 0x28) & 0x3f) & 1) != 0)) {
    if (size == 0) {
      local_44._0_1_ = 0;
      bVar14 = 0;
      uVar4 = '\0';
    }
    else {
      bVar15 = 0;
      local_34 = -0x9d;
      uVar4 = '\0';
      bVar16 = 0;
      bVar14 = 0;
      local_44 = 0;
      bVar17 = false;
      __string = (byte *)string;
      component._52_8_ = uVar13;
      do {
        bVar9 = *__string;
        iVar8 = 1;
        iVar6 = (int)uVar10;
        __length = (int)pnVar11;
        iVar7 = local_34;
        if (bVar9 < 0x3c) {
          if (bVar9 == 0) {
            iVar6 = -1;
            goto LAB_00113bab;
          }
          if (bVar9 == 0x28) {
            iVar6 = re_match((re_pattern_buffer *)")",(char *)__string,__length,iVar6,in_R8);
            pnVar11 = extraout_RDX_01;
            if (iVar6 == -1) {
              local_34 = -0x9e;
              iVar7 = local_34;
            }
            else {
              __string = __string + 1;
              bVar17 = true;
              iVar8 = 5;
            }
          }
          else if (bVar9 == 0x29) {
            uVar5 = pattern->components_size - 1;
            uVar10 = CONCAT71((int7)(uVar10 >> 8),
                              pattern->components[uVar5].subpattern_info | bVar14) | 0x40;
            pattern->components[uVar5].subpattern_info = (uint8_t)uVar10;
            bVar14 = bVar14 + 1;
            __string = __string + 1;
            pnVar11 = pattern;
            iVar8 = 5;
          }
          else {
            local_34 = -0x9e;
            iVar8 = 1;
            iVar7 = local_34;
          }
          goto LAB_00113c0e;
        }
        if (bVar9 == 0x5c) {
          iVar6 = re_match((re_pattern_buffer *)"[0-9]",(char *)__string,__length,iVar6,in_R8);
          pnVar11 = extraout_RDX_00;
          if (iVar6 != -1) {
            uVar4 = uVar4 + '\x01';
            bVar15 = 4;
            goto LAB_00113bab;
          }
LAB_00113bfc:
          local_34 = -0x9e;
          uVar13 = component._52_8_;
          iVar7 = local_34;
        }
        else {
          if (bVar9 == 0x5b) {
            iVar6 = re_match((re_pattern_buffer *)0x1213ee,(char *)__string,__length,iVar6,in_R8);
            pnVar11 = extraout_RDX_02;
            if (iVar6 != -1) {
              bVar15 = 5;
              goto LAB_00113bab;
            }
            goto LAB_00113bfc;
          }
          if (bVar9 != 0x3c) goto LAB_00113bfc;
          iVar6 = re_match((re_pattern_buffer *)"^<>\\*",(char *)__string,__length,iVar6,in_R8);
          if (iVar6 == -1) {
            iVar6 = re_match((re_pattern_buffer *)0x120fd3,(char *)__string,(int)extraout_RDX,
                             (int)uVar10,in_R8);
            pnVar11 = extraout_RDX_03;
            if (iVar6 == -1) goto LAB_00113bfc;
            bVar15 = iVar6 == 2 ^ 3;
          }
          else {
            iVar6 = iVar6 + 2;
            bVar15 = 1;
            pnVar11 = extraout_RDX;
          }
LAB_00113bab:
          if (bVar16 == 1 && bVar15 == 1) {
            local_34 = -0x9f;
            bVar16 = 1;
            bVar15 = 1;
            uVar13 = component._52_8_;
            iVar7 = local_34;
          }
          else {
            component.value[0x2a] = '\0';
            iVar7 = ndn_trust_schema_pattern_component_from_string
                              ((ndn_trust_schema_pattern_component_t *)auStack_a4,(char *)__string,
                               iVar6 + 1U);
            pnVar11 = extraout_RDX_04;
            uVar13 = component._52_8_;
            bVar16 = bVar15;
            if (iVar7 == 0) {
              if (bVar17) {
                component.value[0x2a] = component.value[0x2a] | (byte)local_44 | 0x80;
                bVar9 = (byte)local_44 + 1;
                local_44 = (uint)bVar9;
                uVar10 = (ulong)local_44;
                if (4 < bVar9) {
                  local_34 = -0xa0;
                  pnVar11 = extraout_RDX_04;
                  iVar7 = local_34;
                  goto LAB_00113c0e;
                }
                bVar17 = false;
              }
              pnVar11 = (ndn_trust_schema_pattern_t *)(ulong)pattern->components_size;
              uVar10 = 0xfffffff6;
              if (pattern->components_size + 1 < 0xb) {
                puVar3 = pattern->components[(long)pnVar11].value;
                *(ulong *)(puVar3 + 0x28) = CONCAT44(component.value._36_4_,component.value._32_4_);
                *(ulong *)(puVar3 + 0x30) =
                     CONCAT53(component.value._43_5_,
                              CONCAT12(component.value[0x2a],component.value._40_2_));
                puVar3 = pattern->components[(long)pnVar11].value + 0x1c;
                *(undefined8 *)puVar3 = component.value._20_8_;
                *(ulong *)(puVar3 + 8) = CONCAT44(component.value._32_4_,component.value._28_4_);
                puVar3 = pattern->components[(long)pnVar11].value + 0xc;
                *(undefined8 *)puVar3 = component.value._4_8_;
                *(undefined8 *)(puVar3 + 8) = component.value._12_8_;
                pnVar1 = pattern->components + (long)pnVar11;
                pnVar1->type = auStack_a4._0_4_;
                pnVar1->value[0] = auStack_a4[4];
                pnVar1->value[1] = auStack_a4[5];
                pnVar1->value[2] = auStack_a4[6];
                pnVar1->value[3] = auStack_a4[7];
                *(undefined8 *)(pnVar1->value + 4) = component._0_8_;
                pattern->components_size = pattern->components_size + 1;
                uVar10 = 0;
                __string = __string + (int)(iVar6 + 1U);
                iVar8 = 0;
                pnVar11 = pattern;
                iVar7 = local_34;
              }
              else {
                iVar7 = -10;
              }
            }
          }
        }
LAB_00113c0e:
        local_34 = iVar7;
        if ((iVar8 != 5) && (iVar8 != 0)) {
          return local_34;
        }
      } while ((uint)((int)__string - (int)string) < (uint)uVar13);
    }
    if ((byte)local_44 != bVar14) {
      return -0x9e;
    }
    pattern->num_subpattern_captures = (byte)local_44;
    pattern->num_subpattern_indexes = uVar4;
  }
  else {
    iVar8 = ndn_trust_schema_pattern_component_from_string
                      ((ndn_trust_schema_pattern_component_t *)auStack_a4,string,size);
    if (iVar8 != 0) {
      return iVar8;
    }
    uVar5 = pattern->components_size;
    if (10 < uVar5 + 1) {
      return -10;
    }
    puVar3 = pattern->components[uVar5].value;
    *(ulong *)(puVar3 + 0x28) = CONCAT44(component.value._36_4_,component.value._32_4_);
    *(ulong *)(puVar3 + 0x30) =
         CONCAT53(component.value._43_5_,CONCAT12(component.value[0x2a],component.value._40_2_));
    puVar3 = pattern->components[uVar5].value + 0x1c;
    *(undefined8 *)puVar3 = component.value._20_8_;
    *(ulong *)(puVar3 + 8) = CONCAT44(component.value._32_4_,component.value._28_4_);
    puVar3 = pattern->components[uVar5].value + 0xc;
    *(undefined8 *)puVar3 = component.value._4_8_;
    *(undefined8 *)(puVar3 + 8) = component.value._12_8_;
    pnVar1 = pattern->components + uVar5;
    pnVar1->type = auStack_a4._0_4_;
    pnVar1->value[0] = auStack_a4[4];
    pnVar1->value[1] = auStack_a4[5];
    pnVar1->value[2] = auStack_a4[6];
    pnVar1->value[3] = auStack_a4[7];
    *(undefined8 *)(pnVar1->value + 4) = component._0_8_;
    pattern->components_size = pattern->components_size + 1;
  }
  return 0;
}

Assistant:

int
ndn_trust_schema_pattern_from_string(ndn_trust_schema_pattern_t* pattern,
                                     const char* string, uint32_t size)
{
  if (size == 0) return NDN_TRUST_SCHEMA_PATTERN_STRING_ZERO_LENGTH;

  if (string[size - 1] == '\0') size--;

  for (uint32_t i = 0; i < size - 1; i++) {
    if (string[i] == '\0')
      return NDN_TRUST_SCHEMA_PATTERN_STRING_PREMATURE_TERMINATION;
  }

  int ret_val = -1;

  pattern->components_size = 0;

  // first check if it's a rule reference
  if (string[0] != '<' && string[0] != '(' && string[0] != '['
      && string[0] != '\\') {
    ndn_trust_schema_pattern_component_t component;
    ret_val = ndn_trust_schema_pattern_component_from_string(&component, string, size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;
    return 0;
  }

  // flag to remember whether the pattern component being appended should be
  // marked as the beginning of a subpattern (SPB = Sub Pattern Beginning)
  bool should_add_SPB = false;
  // current subpattern index; will return error if more than
  // NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES subpatterns are found
  uint8_t current_subpattern_capture_begin_index = 0;
  uint8_t current_subpattern_capture_end_index = 0;
  const char* current_string = string;
  uint32_t last_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint32_t current_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint8_t num_subpattern_indexes = 0;
  // iterate through the schema pattern
  while ((uint32_t)(current_string - string) < size) {
    int pattern_comp_end_index = -1;
    switch (current_string[0]) {
      case '<':
        pattern_comp_end_index = re_match("^<>\\*", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL) {
          pattern_comp_end_index = re_match(">", current_string);
          if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
            return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
          else
            current_type = (pattern_comp_end_index == 2)
                               ? NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT
                               : NDN_TRUST_SCHEMA_SINGLE_NAME_COMPONENT;
        } else {
          current_type = NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE;
          pattern_comp_end_index += 2;
        }
        break;
      case '[':
        pattern_comp_end_index = re_match("]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_WILDCARD_SPECIALIZER;
        break;
      case '\\':
        pattern_comp_end_index = re_match("[0-9]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_SUBPATTERN_INDEX;
        num_subpattern_indexes++;
        break;
      case '(':
        // make sure that there is a corresponding end parentheses for this
        // subpattern
        pattern_comp_end_index = re_match(")", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        should_add_SPB = true;
        current_string += 1;
        continue;
      case ')':
        // set the last pattern component's subpattern info to indicate that it
        // was the ending of a subpattern
        pattern->components[pattern->components_size - 1].subpattern_info |=
            (NDN_TRUST_SCHEMA_SUBPATTERN_END_ONLY << 6) |
            (current_subpattern_capture_end_index);
        current_subpattern_capture_end_index++;
        current_string += 1;
        continue;
      default:
        if (current_string[0] == '\0')
          break;
        else
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
    }

    // do not allow more than one consecutive wildcard name component sequences
    if (current_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE
        && last_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE)
      return NDN_TRUST_SCHEMA_PATTERN_INVALID_FORMAT;
    last_type = current_type;

    int pattern_comp_string_len = pattern_comp_end_index + 1;

    ndn_trust_schema_pattern_component_t component;
    component.subpattern_info = 0;
    ret_val = ndn_trust_schema_pattern_component_from_string(
        &component, current_string, pattern_comp_string_len);
    if (ret_val != NDN_SUCCESS) return ret_val;

    if (should_add_SPB) {
      // set the current pattern component's subpattern info to indicate that it
      // was the beginning of a subpattern
      component.subpattern_info |=
          (NDN_TRUST_SCHEMA_SUBPATTERN_BEGIN_ONLY << 6) |
          (current_subpattern_capture_begin_index);
      current_subpattern_capture_begin_index++;
      if (current_subpattern_capture_begin_index + 1 >
          NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES) {
        return NDN_TRUST_SCHEMA_NUMBER_OF_SUBPATTERNS_EXCEEDS_LIMIT;
      }
      should_add_SPB = false;
    }

    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;

    current_string += pattern_comp_end_index + 1;
  }

  if (current_subpattern_capture_begin_index !=
      current_subpattern_capture_end_index) {
    return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
  }

  pattern->num_subpattern_captures = current_subpattern_capture_begin_index;
  pattern->num_subpattern_indexes = num_subpattern_indexes;

  return 0;
}